

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O1

void mcode_allocarea(jit_State *J)

{
  MCode *pMVar1;
  bool bVar2;
  long *plVar3;
  MCode *__addr;
  long *__addr_00;
  uint64_t uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  int iVar7;
  long *unaff_RBP;
  ulong __len;
  bool bVar8;
  bool bVar9;
  
  pMVar1 = J->mcarea;
  __len = (long)J->param[0xd] * 0x400 + 0xfffU & 0xfffffffffffff000;
  __addr = pMVar1 + -__len;
  if (pMVar1 == (MCode *)0x0) {
    __addr = (MCode *)0x0;
  }
  iVar7 = 0;
  do {
    if (__addr != (MCode *)0x0) {
      __addr_00 = (long *)mmap64(__addr,__len,3,0x22,-1,0);
      bVar2 = true;
      plVar3 = unaff_RBP;
      if ((1 < (long)__addr_00 + 1U) &&
         (bVar8 = 0x3fdfffff < (__len - 0x120000) + (long)__addr_00,
         bVar9 = 0x3fdfffff < 0x120000U - (long)__addr_00, bVar2 = bVar9 && bVar8,
         plVar3 = __addr_00, bVar9 && bVar8)) {
        munmap(__addr_00,__len);
        bVar2 = true;
        plVar3 = unaff_RBP;
      }
      unaff_RBP = plVar3;
      if (!bVar2) {
        J->mcarea = (MCode *)unaff_RBP;
        J->szmcarea = __len;
        J->mcprot = 3;
        J->mctop = (MCode *)((long)unaff_RBP + __len);
        J->mcbot = (MCode *)(unaff_RBP + 2);
        *unaff_RBP = (long)pMVar1;
        unaff_RBP[1] = __len;
        J->szallmcarea = J->szallmcarea + __len;
        puVar6 = lj_err_register_mcode(unaff_RBP,__len,(uint8_t *)(unaff_RBP + 2));
        J->mcbot = puVar6;
        return;
      }
    }
    do {
      uVar4 = lj_prng_u64(&J->prng);
      uVar5 = (ulong)((uint)uVar4 & 0x7fff0000);
    } while (0x7fbfffff < uVar5 + __len);
    __addr = (MCode *)(uVar5 - 0x3fce0000);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x1f);
  lj_trace_err(J,LJ_TRERR_MCODEAL);
}

Assistant:

static void mcode_allocarea(jit_State *J)
{
  MCode *oldarea = J->mcarea;
  size_t sz = (size_t)J->param[JIT_P_sizemcode] << 10;
  sz = (sz + LJ_PAGESIZE-1) & ~(size_t)(LJ_PAGESIZE - 1);
  J->mcarea = (MCode *)mcode_alloc(J, sz);
  J->szmcarea = sz;
  J->mcprot = MCPROT_GEN;
  J->mctop = (MCode *)((char *)J->mcarea + J->szmcarea);
  J->mcbot = (MCode *)((char *)J->mcarea + sizeof(MCLink));
  ((MCLink *)J->mcarea)->next = oldarea;
  ((MCLink *)J->mcarea)->size = sz;
  J->szallmcarea += sz;
  J->mcbot = (MCode *)lj_err_register_mcode(J->mcarea, sz, (uint8_t *)J->mcbot);
}